

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# num_parse.h
# Opt level: O2

array<unsigned_char,_4UL>
mvm::num::serial<unsigned_int,4ul,mvm::num::little_endian_tag>(string *str)

{
  int __base;
  unsigned_long_long uVar1;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)str);
  __base = details::base(&local_30);
  uVar1 = std::__cxx11::stoull(str,(size_t *)0x0,__base);
  std::__cxx11::string::~string((string *)&local_30);
  return (array<unsigned_char,_4UL>)SUB84(uVar1,0);
}

Assistant:

std::array<uint8_t, N> serial(std::string const &str) {
  std::array<uint8_t, N> res;
  if constexpr (std::is_floating_point_v<T>) {
    res = serial_floating<T, N>(std::stod(str));
  } else if constexpr (std::is_integral_v<T> && std::is_unsigned_v<T>) {
    res = serial_unsigned<N>(std::stoull(str, nullptr, details::base(str)));
  } else if constexpr (std::is_integral_v<T> && std::is_signed_v<T>) {
    res = serial_signed<T, N>(std::stoll(str, nullptr, details::base(str)));
  }

  return details::to_endian<N, little_endian_tag, Endian>()(&res[0]);
}